

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O2

void process_playing(DUMB_IT_SIGRENDERER *sigrenderer,IT_PLAYING *playing,float invt2g)

{
  int *piVar1;
  uint uVar2;
  DUMB_IT_SIGDATA *pDVar3;
  DUMB_IT_SIGDATA *pDVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  IT_SAMPLE *pIVar8;
  uchar uVar9;
  IT_ENVELOPE *envelope;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  pDVar3 = sigrenderer->sigdata;
  if (playing->instrument != (IT_INSTRUMENT *)0x0) {
    envelope = &playing->env_instrument->volume_envelope;
    if ((pDVar3->flags & 0x40) == 0) {
      iVar6 = update_it_envelope(playing,envelope,&playing->volume_envelope,1);
      if (iVar6 != 0) {
        uVar2 = playing->flags;
        playing->flags = uVar2 | 4;
        if ((playing->volume_envelope).value == 0) {
          playing->flags = uVar2 | 0xc;
        }
      }
      update_it_envelope(playing,&playing->env_instrument->pan_envelope,&playing->pan_envelope,2);
      update_it_envelope(playing,&playing->env_instrument->pitch_envelope,&playing->pitch_envelope,4
                        );
    }
    else {
      update_xm_envelope(playing,envelope,&playing->volume_envelope);
      update_xm_envelope(playing,&playing->env_instrument->pan_envelope,&playing->pan_envelope);
    }
    if ((playing->flags & 4U) != 0) {
      iVar7 = playing->env_instrument->fadeout;
      piVar1 = &playing->fadeoutcount;
      iVar6 = *piVar1;
      *piVar1 = *piVar1 - iVar7;
      if ((*piVar1 == 0 || SBORROW4(iVar6,iVar7) != *piVar1 < 0) &&
         (playing->fadeoutcount = 0, (pDVar3->flags & 0x40) == 0)) {
        playing->flags = playing->flags | 8;
      }
    }
  }
  pDVar4 = sigrenderer->sigdata;
  iVar6 = sigrenderer->ramp_style;
  iVar7 = apply_pan_envelope(playing);
  if (((sigrenderer->n_channels < 2) || ((pDVar4->flags & 1) == 0)) ||
     (sigrenderer->n_channels == 3 && 0x4000 < iVar7)) {
    playing->float_volume[0] = 1.0;
    fVar10 = 1.0;
  }
  else if (iVar7 < 0x4001) {
    fVar10 = (float)((iVar7 + -0x2000) * pDVar4->pan_separation) * 4.7683716e-07;
    playing->float_volume[0] = 0.5 - fVar10;
    fVar10 = fVar10 + 0.5;
  }
  else {
    playing->float_volume[0] = -0.5;
    fVar10 = 0.5;
  }
  playing->float_volume[1] = fVar10;
  fVar10 = calculate_volume(sigrenderer,playing,1.0);
  fVar12 = fVar10 * (float)*(undefined8 *)playing->float_volume;
  fVar13 = fVar10 * (float)((ulong)*(undefined8 *)playing->float_volume >> 0x20);
  *(ulong *)playing->float_volume = CONCAT44(fVar13,fVar12);
  if (iVar6 < 1) {
    bVar5 = playing->declick_stage;
    if (iVar6 != 0) {
      fVar14 = 4.0;
      goto LAB_00585ea9;
    }
    uVar9 = '\x02';
    if (2 < bVar5) {
      playing->float_volume[0] = 0.0;
      playing->float_volume[1] = 0.0;
      fVar12 = 0.0;
      fVar13 = 0.0;
      uVar9 = '\x05';
    }
LAB_00585f1d:
    *(ulong *)playing->ramp_volume = CONCAT44(fVar13,fVar12);
    playing->declick_stage = uVar9;
    playing->ramp_delta[0] = 0.0;
    fVar10 = 0.0;
    goto LAB_00585f2b;
  }
  bVar5 = playing->declick_stage;
  fVar14 = 4.0;
  if ((bVar5 == 2) &&
     (((playing->ramp_volume[0] == 0.0 && (playing->ramp_volume[1] == 0.0)) ||
      (fVar14 = 4.0, fVar10 == 0.0)))) {
    fVar14 = 48.0;
  }
  if (iVar6 == 1) {
LAB_00585ea9:
    uVar9 = '\x02';
    if (bVar5 == 2) goto LAB_00585f1d;
  }
  fVar11 = 48.0;
  fVar10 = fVar11;
  if (bVar5 != 1) {
    if (bVar5 == 0) {
      playing->ramp_volume[0] = 0.0;
      playing->ramp_volume[1] = 0.0;
      uVar9 = '\x01';
LAB_00585ec9:
      playing->declick_stage = uVar9;
      fVar10 = fVar11;
    }
    else {
      fVar10 = fVar14;
      if (2 < bVar5) {
        playing->float_volume[0] = 0.0;
        playing->float_volume[1] = 0.0;
        fVar12 = 0.0;
        fVar13 = 0.0;
        uVar9 = '\x04';
        fVar10 = fVar11;
        if (bVar5 == 3) goto LAB_00585ec9;
      }
    }
  }
  playing->ramp_delta[0] = (fVar12 - playing->ramp_volume[0]) * fVar10 * invt2g;
  fVar10 = (fVar13 - playing->ramp_volume[1]) * fVar10 * invt2g;
LAB_00585f2b:
  playing->ramp_delta[1] = fVar10;
  if ((pDVar3->flags & 0x40) == 0) {
    pIVar8 = playing->sample;
    iVar7 = (uint)pIVar8->vibrato_rate + playing->sample_vibrato_depth;
    iVar6 = (uint)pIVar8->vibrato_depth << 8;
    if (iVar7 < iVar6) {
      iVar6 = iVar7;
    }
    playing->sample_vibrato_depth = iVar6;
  }
  else {
    pIVar8 = playing->sample;
    if (playing->sample_vibrato_depth < (int)(uint)pIVar8->vibrato_rate) {
      playing->sample_vibrato_depth = playing->sample_vibrato_depth + 1;
    }
  }
  playing->sample_vibrato_time = playing->sample_vibrato_time + pIVar8->vibrato_speed;
  return;
}

Assistant:

static void process_playing(DUMB_IT_SIGRENDERER *sigrenderer, IT_PLAYING *playing, float invt2g)
{
	DUMB_IT_SIGDATA * sigdata = sigrenderer->sigdata;

	if (playing->instrument) {
		if (sigdata->flags & IT_WAS_AN_XM)
			update_xm_envelopes(playing);
		else
			update_it_envelopes(playing);
		update_fadeout(sigdata, playing);
	}

	playing_volume_setup(sigrenderer, playing, invt2g);

	if (sigdata->flags & IT_WAS_AN_XM) {
		/* 'depth' is used to store the tick number for XM files. */
		if (playing->sample_vibrato_depth < playing->sample->vibrato_rate)
			playing->sample_vibrato_depth++;
	} else {
		playing->sample_vibrato_depth += playing->sample->vibrato_rate;
		if (playing->sample_vibrato_depth > playing->sample->vibrato_depth << 8)
			playing->sample_vibrato_depth = playing->sample->vibrato_depth << 8;
	}

	playing->sample_vibrato_time += playing->sample->vibrato_speed;
}